

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

data<Imath_3_2::half> * __thiscall
anon_unknown.dwarf_6c49c::data<Imath_3_2::half>::operator<<(data<Imath_3_2::half> *this,float value)

{
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *this_00;
  half *this_01;
  half local_1c;
  half local_1a;
  
  if (this->_inserting_result == true) {
    this_00 = &this->_current_result;
    this_01 = &local_1a;
  }
  else {
    this_00 = &this->_current_sample;
    this_01 = &local_1c;
  }
  Imath_3_2::half::half(this_01,value);
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::emplace_back<Imath_3_2::half>
            (this_00,this_01);
  this->_started = true;
  return this;
}

Assistant:

data& operator<< (float value)
    {
        if (_inserting_result) { _current_result.push_back (value); }
        else { _current_sample.push_back (T (value)); }
        _started = true;
        return *this;
    }